

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
               (hugeint_t *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  hugeint_t hVar12;
  hugeint_t input;
  hugeint_t input_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    iVar7 = count;
    while (bVar11 = iVar7 != 0, iVar7 = iVar7 - 1, bVar11) {
      hVar12.upper = count;
      hVar12.lower = *(uint64_t *)((long)&ldata->lower + lVar5);
      hVar12 = NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
                         (*(NegateOperator **)((long)ldata + lVar5 + -8),hVar12);
      count = hVar12.upper;
      *(uint64_t *)((long)result_data + lVar5 + -8) = hVar12.lower;
      *(idx_t *)((long)&result_data->lower + lVar5) = count;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      uVar4 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      uVar4 = extraout_RDX_00;
    }
    uVar9 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
LAB_014da9cc:
        uVar6 = uVar9 << 4 | 8;
        for (; uVar2 = uVar9, uVar9 < uVar10; uVar9 = uVar9 + 1) {
          input.upper = uVar4;
          input.lower = *(uint64_t *)((long)&ldata->lower + uVar6);
          hVar12 = NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
                             (*(NegateOperator **)((long)ldata + (uVar6 - 8)),input);
          uVar4 = hVar12.upper;
          *(uint64_t *)((long)result_data + (uVar6 - 8)) = hVar12.lower;
          *(ulong *)((long)&result_data->lower + uVar6) = uVar4;
          uVar6 = uVar6 + 0x10;
        }
      }
      else {
        uVar4 = puVar1[uVar3];
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_014da9cc;
        uVar2 = uVar10;
        if (uVar4 != 0) {
          uVar6 = uVar9 << 4 | 8;
          for (uVar8 = 0; uVar2 = uVar9 + uVar8, uVar9 + uVar8 < uVar10; uVar8 = uVar8 + 1) {
            if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
              input_00.upper = uVar4;
              input_00.lower = *(uint64_t *)((long)&ldata->lower + uVar6);
              hVar12 = NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
                                 (*(NegateOperator **)((long)ldata + (uVar6 - 8)),input_00);
              *(uint64_t *)((long)result_data + (uVar6 - 8)) = hVar12.lower;
              *(int64_t *)((long)&result_data->lower + uVar6) = hVar12.upper;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar9 = uVar2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}